

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_context__try_get_device_name_by_id
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    char *pName,size_t nameBufferSize)

{
  ma_context *pmVar1;
  ma_result mVar2;
  ma_context__try_get_device_name_by_id__enum_callback_data data;
  ma_device_type local_38 [2];
  ma_device_id *local_30;
  char *local_28;
  undefined8 local_20;
  int local_18;
  
  if (pName != (char *)0x0) {
    if (pDeviceID == (ma_device_id *)0x0) {
      mVar2 = -0x68;
    }
    else {
      local_20 = 0x100;
      local_18 = 0;
      if (pContext->onEnumDevices ==
          (_func_ma_result_ma_context_ptr_ma_enum_devices_callback_proc_void_ptr *)0x0) {
        mVar2 = -2;
      }
      else {
        pmVar1 = (pContext->deviceEnumLock).pContext;
        local_38[0] = deviceType;
        local_30 = pDeviceID;
        local_28 = pName;
        if (pmVar1 != (ma_context *)0x0) {
          (*(pmVar1->field_22).posix.pthread_mutex_lock)(&(pContext->deviceEnumLock).field_1);
        }
        mVar2 = (*pContext->onEnumDevices)
                          (pContext,ma_context__try_get_device_name_by_id__enum_callback,local_38);
        pmVar1 = (pContext->deviceEnumLock).pContext;
        if (pmVar1 != (ma_context *)0x0) {
          (*(pmVar1->field_22).posix.pthread_mutex_unlock)(&(pContext->deviceEnumLock).field_1);
        }
      }
      if ((mVar2 == 0) && (mVar2 = -0x68, local_18 != 0)) {
        mVar2 = 0;
      }
    }
    return mVar2;
  }
  __assert_fail("pName != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x2420,
                "ma_result ma_context__try_get_device_name_by_id(ma_context *, ma_device_type, const ma_device_id *, char *, size_t)"
               );
}

Assistant:

static ma_result ma_context__try_get_device_name_by_id(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, char* pName, size_t nameBufferSize)
{
    ma_result result;
    ma_context__try_get_device_name_by_id__enum_callback_data data;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pName != NULL);

    if (pDeviceID == NULL) {
        return MA_NO_DEVICE;
    }

    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.pName = pName;
    data.nameBufferSize = nameBufferSize;
    data.foundDevice = MA_FALSE;
    result = ma_context_enumerate_devices(pContext, ma_context__try_get_device_name_by_id__enum_callback, &data);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (!data.foundDevice) {
        return MA_NO_DEVICE;
    } else {
        return MA_SUCCESS;
    }
}